

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O2

int wally_hex_to_bytes(char *hex,uchar *bytes_out,size_t len,size_t *written)

{
  _Bool _Var1;
  ulong slen;
  ulong bufsize;
  
  if (hex == (char *)0x0) {
    slen = 0;
  }
  else {
    slen = strlen(hex);
  }
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((slen & 1) == 0 && ((len != 0 && bytes_out != (uchar *)0x0) && hex != (char *)0x0)) {
    bufsize = slen >> 1;
    if (len < bufsize) {
      if (written == (size_t *)0x0) {
        return 0;
      }
    }
    else {
      _Var1 = hex_decode(hex,slen,bytes_out,bufsize);
      if (!_Var1 || written == (size_t *)0x0) {
        return (uint)_Var1 * 2 + -2;
      }
    }
    *written = bufsize;
    return 0;
  }
  return -2;
}

Assistant:

int wally_hex_to_bytes(const char *hex,
                       unsigned char *bytes_out, size_t len, size_t *written)
{
    size_t bytes_len = hex ? strlen(hex) : 0;

    if (written)
        *written = 0;

    if (!hex || !bytes_out || !len || bytes_len & 0x1)
        return WALLY_EINVAL;

    if (len < bytes_len / 2) {
        if (written)
            *written = bytes_len / 2;
        return WALLY_OK; /* Not enough room in bytes_out, or empty string */
    }

    len = bytes_len / 2; /* hex_decode expects exact length */
    if (!hex_decode(hex, bytes_len, bytes_out, len))
        return WALLY_EINVAL;

    if (written)
        *written = len;

    return WALLY_OK;
}